

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.c
# Opt level: O0

int main(void)

{
  int iVar1;
  
  memset(item,0,0x40);
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_25/FSMaxB[P]cJSON/tests/parse_number.c"
            );
  UnityDefaultTestRun(parse_number_should_parse_zero,"parse_number_should_parse_zero",0x68);
  UnityDefaultTestRun(parse_number_should_parse_negative_integers,
                      "parse_number_should_parse_negative_integers",0x69);
  UnityDefaultTestRun(parse_number_should_parse_positive_integers,
                      "parse_number_should_parse_positive_integers",0x6a);
  UnityDefaultTestRun(parse_number_should_parse_positive_reals,
                      "parse_number_should_parse_positive_reals",0x6b);
  UnityDefaultTestRun(parse_number_should_parse_negative_reals,
                      "parse_number_should_parse_negative_reals",0x6c);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

main(void)
{
    /* initialize cJSON item */
    memset(item, 0, sizeof(cJSON));
    UNITY_BEGIN();
    RUN_TEST(parse_number_should_parse_zero);
    RUN_TEST(parse_number_should_parse_negative_integers);
    RUN_TEST(parse_number_should_parse_positive_integers);
    RUN_TEST(parse_number_should_parse_positive_reals);
    RUN_TEST(parse_number_should_parse_negative_reals);
    return UNITY_END();
}